

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[13],kj::String,char_const(&)[4],int_const&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [13],String *params_1,
          char (*params_2) [4],int *params_3,char (*params_4) [2])

{
  char (*value) [13];
  String *value_00;
  char (*value_01) [4];
  kj *this_00;
  char (*value_02) [2];
  int *value_03;
  ArrayPtr<const_char> *in_stack_ffffffffffffff58;
  ArrayPtr<const_char> local_90;
  CappedArray<char,_14UL> local_80;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  char (*local_38) [2];
  char (*params_local_4) [2];
  int *params_local_3;
  char (*params_local_2) [4];
  String *params_local_1;
  char (*params_local) [13];
  
  local_38 = (char (*) [2])params_3;
  params_local_4 = (char (*) [2])params_2;
  params_local_3 = (int *)params_1;
  params_local_2 = (char (*) [4])params;
  params_local_1 = (String *)this;
  params_local = (char (*) [13])__return_storage_ptr__;
  value = ::const((char (*) [13])this);
  local_48 = toCharSequence<char_const(&)[13]>(value);
  value_00 = fwd<kj::String>((NoInfer<kj::String> *)params_local_2);
  local_58 = toCharSequence<kj::String>(value_00);
  value_01 = ::const((char (*) [4])params_local_3);
  local_68 = toCharSequence<char_const(&)[4]>(value_01);
  this_00 = (kj *)fwd<int_const&>((int *)params_local_4);
  toCharSequence<int_const&>(&local_80,this_00,value_03);
  value_02 = ::const(local_38);
  local_90 = toCharSequence<char_const(&)[2]>(value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_48,&local_58,&local_68,
             (ArrayPtr<const_char> *)&local_80,(CappedArray<char,_14UL> *)&local_90,
             in_stack_ffffffffffffff58);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}